

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FZFile.cpp
# Opt level: O2

char * FZFile::decompress(char *file_buf,size_t buffer_size,size_t *output_size)

{
  size_t __nmemb;
  int iVar1;
  uint uVar2;
  char *__dest;
  char *__src;
  ulong __n;
  char *local_a0;
  undefined4 local_98;
  char *local_88;
  int local_80;
  ulong local_78;
  undefined8 local_70;
  undefined8 local_60;
  undefined8 uStack_58;
  
  *output_size = buffer_size;
  if (buffer_size != 0) {
    __dest = (char *)calloc(buffer_size,1);
    local_98 = (undefined4)buffer_size;
    local_78 = 0;
    local_60 = 0;
    uStack_58 = 0;
    local_a0 = file_buf;
    iVar1 = inflateInit_(&local_a0,"1.2.11",0x70);
    if (iVar1 == 0) {
      __src = __dest;
      do {
        __n = *output_size;
        __dest = __src;
        if (__n <= local_78) {
          __nmemb = (buffer_size >> 1) + __n;
          __dest = (char *)calloc(__nmemb,1);
          memcpy(__dest,__src,__n);
          *output_size = __nmemb;
          free(__src);
          __n = *output_size;
        }
        local_88 = __dest + local_78;
        local_80 = (int)__n - (int)local_78;
        uVar2 = inflate(&local_a0,2);
        __src = __dest;
      } while (uVar2 == 0);
      if (uVar2 != 1) {
        printf("Error %d: %s\n",(ulong)uVar2,local_70);
      }
      iVar1 = inflateEnd(&local_a0);
      if (iVar1 == 0) {
        return __dest;
      }
    }
    free(__dest);
  }
  return (char *)0x0;
}

Assistant:

char *FZFile::decompress(char *file_buf, size_t buffer_size, size_t &output_size) {
	output_size = buffer_size;
	if (buffer_size == 0) return nullptr;

	char *output = (char *)calloc(output_size, sizeof(char));

	z_stream zst;
	zst.next_in   = (Bytef *)file_buf;
	zst.avail_in  = buffer_size;
	zst.total_out = 0;
	zst.zalloc    = Z_NULL;
	zst.zfree     = Z_NULL;

	if (inflateInit(&zst) != Z_OK) {
		free(output);
		return nullptr;
	}

	int ret;
	do {
		// If our output buffer is too small
		if (zst.total_out >= output_size) {
			// Increase size of output buffer
			char *buf = (char *)calloc(output_size + buffer_size / 2, sizeof(char));
			memcpy(buf, output, output_size);
			output_size += buffer_size / 2;
			free(output);
			output = buf;
		}

		zst.next_out  = (Bytef *)(output + zst.total_out);
		zst.avail_out = output_size - zst.total_out;
	} while ((ret = inflate(&zst, Z_SYNC_FLUSH)) == Z_OK);

	if (ret != Z_STREAM_END) printf("Error %d: %s\n", ret, zst.msg);

	if (inflateEnd(&zst) != Z_OK) {
		free(output);
		return nullptr;
	}

	return output;
}